

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv_signal_init(uv_loop_t *loop,uv_signal_t *handle)

{
  uv__queue *puVar1;
  int iVar2;
  
  iVar2 = uv__signal_loop_once_init(loop);
  if (iVar2 == 0) {
    handle->loop = loop;
    handle->type = UV_SIGNAL;
    handle->flags = 8;
    (handle->handle_queue).next = &loop->handle_queue;
    puVar1 = (loop->handle_queue).prev;
    (handle->handle_queue).prev = puVar1;
    puVar1->next = &handle->handle_queue;
    (loop->handle_queue).prev = &handle->handle_queue;
    handle->next_closing = (uv_handle_t *)0x0;
    handle->signum = 0;
    handle->caught_signals = 0;
    handle->dispatched_signals = 0;
  }
  return iVar2;
}

Assistant:

int uv_signal_init(uv_loop_t* loop, uv_signal_t* handle) {
  int err;

  err = uv__signal_loop_once_init(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_SIGNAL);
  handle->signum = 0;
  handle->caught_signals = 0;
  handle->dispatched_signals = 0;

  return 0;
}